

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O0

tai * __thiscall Kumu::TAI::tai::operator=(tai *this,caltime *rhs)

{
  caltime *rhs_local;
  tai *this_local;
  
  caltime_tai(rhs,this);
  return this;
}

Assistant:

const Kumu::TAI::tai&
Kumu::TAI::tai::operator=(const Kumu::TAI::caltime& rhs)
{
  caltime_tai(&rhs, this);
  return *this;
}